

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  lua_Integer lVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char *__s_00;
  long n;
  size_t __n;
  char *__n_00;
  size_t l2;
  size_t l1;
  MatchState ms;
  
  pcVar3 = luaL_checklstring(L,1,&l1);
  __s = luaL_checklstring(L,2,&l2);
  lVar4 = luaL_optinteger(L,3,1);
  uVar6 = lVar4 >> 0x3f & l1 + 1;
  lVar7 = uVar6 + lVar4;
  if (lVar7 == 0 || SCARRY8(uVar6,lVar4) != lVar7 < 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = lVar7 - 1;
    if (l1 < uVar6) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
      return 1;
    }
  }
  if ((find == 0) ||
     ((iVar2 = lua_toboolean(L,4), iVar2 == 0 &&
      (pcVar5 = strpbrk(__s,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    cVar1 = *__s;
    ms.src_end = pcVar3 + l1;
    n = 1;
    ms.src_init = pcVar3;
    ms.L = L;
    if (1 < lVar7) {
      n = lVar7;
    }
    do {
      lVar7 = n + -1;
      ms.level = 0;
      ms.depth = 0;
      pcVar5 = match(&ms,pcVar3 + lVar7,__s + (cVar1 == '^'));
      if (pcVar5 != (char *)0x0) {
        if (find != 0) {
          lua_pushinteger(L,n);
          lua_pushinteger(L,(long)pcVar5 - (long)pcVar3);
          iVar2 = push_captures(&ms,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures(&ms,pcVar3 + n + -1,pcVar5);
        return iVar2;
      }
    } while ((cVar1 != '^') && (n = n + 1, pcVar3 + lVar7 < ms.src_end));
  }
  else {
    pcVar5 = pcVar3 + uVar6;
    if (l2 == 0) {
LAB_0013ef06:
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (1 - (long)pcVar3)));
      lua_pushinteger(L,(lua_Integer)(pcVar5 + (l2 - (long)pcVar3)));
      return 2;
    }
    if (l2 <= l1 - uVar6) {
      __n = l2 - 1;
      __n_00 = (char *)((l1 - uVar6) - __n);
      __s_00 = pcVar5;
      while ((__n_00 != (char *)0x0 &&
             (pcVar5 = (char *)memchr(__s_00,(int)*__s,(size_t)__n_00), pcVar5 != (char *)0x0))) {
        __s1 = pcVar5 + 1;
        iVar2 = bcmp(__s1,__s + 1,__n);
        if (iVar2 == 0) goto LAB_0013ef06;
        __n_00 = __s_00 + ((long)__n_00 - (long)__s1);
        __s_00 = __s1;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) {
    init = 0;
  } else if ((size_t)(init) > l1) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    init = (ptrdiff_t)l1;
#endif
  }
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-(size_t)init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+(ptrdiff_t)l2);
      return 2;
    }
  } else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = ms.depth = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
	if (find) {
	  lua_pushinteger(L, s1-s+1);  /* start */
	  lua_pushinteger(L, res-s);   /* end */
	  return push_captures(&ms, NULL, 0) + 2;
	} else {
	  return push_captures(&ms, s1, res);
	}
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}